

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

void PrintSumm(char *type,int nfail,int nrun,int nerrs)

{
  if (nfail < 1) {
    printf("All tests for %3s driver passed the threshold (%6d tests run)\n",type,nrun);
  }
  else {
    printf("%3s driver: %d out of %d tests failed to pass the threshold\n",type);
  }
  if (0 < nerrs) {
    printf("%6d error messages recorded\n",(ulong)(uint)nerrs);
    return;
  }
  return;
}

Assistant:

void
PrintSumm(const char *type, int nfail, int nrun, int nerrs)
{
    if ( nfail > 0 )
	printf("%3s driver: %d out of %d tests failed to pass the threshold\n",
	       type, nfail, nrun);
    else
	printf("All tests for %3s driver passed the threshold (%6d tests run)\n", type, nrun);

    if ( nerrs > 0 )
	printf("%6d error messages recorded\n", nerrs);
}